

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O0

ans_sint_encode<1U> * ans_sint_encode<1U>::create(uint32_t *in_u32,size_t n)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  int iVar1;
  uint32_t uVar2;
  uint *puVar3;
  ulong __n;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  uint64_t uVar7;
  ulong in_RDX;
  long in_RSI;
  ans_sint_encode<1U> *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  size_t i_1;
  uint32_t in_stack_0000008c;
  bool in_stack_00000093;
  uint32_t in_stack_00000094;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000098;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  size_t i;
  uint32_t max_sym;
  ans_sint_encode<1U> *model;
  undefined4 in_stack_ffffffffffffff18;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffff1c;
  uint32_t uVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff20;
  allocator_type *in_stack_ffffffffffffff28;
  value_type_conflict2 *in_stack_ffffffffffffff30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<enc_entry_sint,_std::allocator<enc_entry_sint>_> *this_00;
  ulong local_a8;
  ans_sint_encode<1U> *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  ulong local_68;
  undefined1 local_49 [33];
  ulong local_28;
  uint local_20;
  byte local_19;
  ulong local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ans_sint_encode((ans_sint_encode<1U> *)in_stack_ffffffffffffff20._M_current);
  local_20 = 0;
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    puVar3 = std::max<unsigned_int>((uint *)(local_10 + local_28 * 4),&local_20);
    local_20 = *puVar3;
  }
  __n = (ulong)(local_20 + 1);
  local_49._1_8_ = 0;
  this_00 = (vector<enc_entry_sint,_std::allocator<enc_entry_sint>_> *)local_49;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x207d01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,__n,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x207d2f);
  for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_49 + 9),
                        (ulong)*(uint *)(local_10 + local_68 * 4));
    *pvVar4 = *pvVar4 + 1;
  }
  adjust_freqs(in_stack_00000098,in_stack_00000094,in_stack_00000093,in_stack_0000008c);
  this = &local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  __last._M_current._4_4_ = in_stack_ffffffffffffff1c;
  __last._M_current._0_4_ = in_stack_ffffffffffffff18;
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (in_stack_ffffffffffffff20,__last,0);
  in_RDI->frame_size = (long)iVar1;
  uVar2 = 0;
  local_a0 = (ans_sint_encode<1U> *)0x1000000000;
  std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::resize(this_00,__n);
  for (local_a8 = 0; local_a8 <= local_20; local_a8 = local_a8 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_a8);
    if (*pvVar5 != 0) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      vVar8 = *pvVar5;
      pvVar6 = std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->freq = vVar8;
      uVar9 = uVar2;
      pvVar6 = std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->base = uVar9;
      in_stack_ffffffffffffff20._M_current = (uint *)local_a0;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      uVar7 = (long)in_stack_ffffffffffffff20._M_current * (ulong)*pvVar5;
      pvVar6 = std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->sym_upper_bound = uVar7;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      uVar2 = *pvVar5 + uVar2;
    }
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  if ((local_19 & 1) == 0) {
    ~ans_sint_encode((ans_sint_encode<1U> *)in_stack_ffffffffffffff20._M_current);
  }
  return in_RDI;
}

Assistant:

static ans_sint_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_sint_encode model;
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            max_sym = std::max(in_u32[i], max_sym);
        }
        std::vector<uint64_t> freqs(max_sym + 1, 0);
        for (size_t i = 0; i < n; i++) {
            freqs[in_u32[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, false, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;

        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym <= max_sym; sym++) {
            if (model.nfreqs[sym] == 0)
                continue;
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }